

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

uint __thiscall llvm::APInt::countLeadingOnesSlowCase(APInt *this)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar1 = this->BitWidth;
  uVar10 = uVar1 & 0x3f;
  bVar5 = 0x40 - (char)uVar10;
  uVar8 = (ulong)uVar1 + 0x3f >> 6;
  uVar9 = 0x40;
  if (uVar10 != 0) {
    uVar9 = uVar10;
  }
  if (uVar10 == 0) {
    bVar5 = 0;
  }
  uVar4 = (this->U).pVal[uVar8 - 1] << (bVar5 & 0x3f) ^ 0xffffffffffffffff;
  if (uVar4 == 0) {
    uVar10 = 0x40;
  }
  else {
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar10 = (uint)lVar3 ^ 0x3f;
  }
  if (0x40 < uVar1 && uVar9 == uVar10) {
    iVar6 = (int)uVar8 + -1;
    uVar10 = uVar9;
    do {
      uVar8 = (this->U).pVal[iVar6 - 1];
      if (uVar8 != 0xffffffffffffffff) {
        uVar8 = ~uVar8;
        lVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        return ((uint)lVar3 ^ 0x3f) + uVar10;
      }
      uVar10 = uVar10 + 0x40;
      iVar7 = iVar6 + -1;
      bVar2 = 0 < iVar6;
      iVar6 = iVar7;
    } while (iVar7 != 0 && bVar2);
  }
  return uVar10;
}

Assistant:

unsigned APInt::countLeadingOnesSlowCase() const {
  unsigned highWordBits = BitWidth % APINT_BITS_PER_WORD;
  unsigned shift;
  if (!highWordBits) {
    highWordBits = APINT_BITS_PER_WORD;
    shift = 0;
  } else {
    shift = APINT_BITS_PER_WORD - highWordBits;
  }
  int i = getNumWords() - 1;
  unsigned Count = llvm::countLeadingOnes(U.pVal[i] << shift);
  if (Count == highWordBits) {
    for (i--; i >= 0; --i) {
      if (U.pVal[i] == WORD_MAX)
        Count += APINT_BITS_PER_WORD;
      else {
        Count += llvm::countLeadingOnes(U.pVal[i]);
        break;
      }
    }
  }
  return Count;
}